

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::setArguments(QProcess *this,QStringList *arguments)

{
  QObjectData *pQVar1;
  long in_FS_OFFSET;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  if (*(char *)((long)&pQVar1[8].children.d.ptr + 4) == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QArrayDataPointer<QString>::operator=
                ((QArrayDataPointer<QString> *)&pQVar1[7].children,&arguments->d);
      return;
    }
  }
  else {
    local_28.context.version = 2;
    local_28.context.function._4_4_ = 0;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning(&local_28,"QProcess::setProgram: Process is already running");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::setArguments(const QStringList &arguments)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::setProgram: Process is already running");
        return;
    }
    d->arguments = arguments;
}